

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O3

void __thiscall
duckdb::CompressedMaterialization::CreateCompressProjection
          (CompressedMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *child_op,
          vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
          *compress_exprs,CompressedMaterializationInfo *info,CMChildInfo *child_info)

{
  optional_ptr<duckdb::LogicalOperator,_true> *this_00;
  pointer puVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  pointer pCVar3;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var4;
  CompressedMaterializationInfo *pCVar5;
  BaseStatistics *pBVar6;
  pointer pCVar7;
  idx_t iVar8;
  LogicalProjection *this_01;
  pointer pLVar9;
  pointer pLVar10;
  reference pvVar11;
  reference __args_1;
  const_reference __args_2;
  iterator __it;
  reference this_02;
  idx_t iVar12;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
  *__range1;
  size_type sVar13;
  unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
  *compress_expr;
  pointer this_03;
  pointer __k;
  type binding_info_local;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  projections;
  ColumnBindingReplacer replacer;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_d0;
  CompressedMaterialization *local_c8;
  CompressedMaterializationInfo *local_c0;
  undefined1 local_b8 [40];
  undefined1 local_90;
  BaseStatistics *local_88;
  pointer local_78;
  pointer pCStack_70;
  pointer local_68;
  vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
  *local_60;
  undefined1 local_58 [8];
  vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_> local_50;
  optional_ptr<duckdb::LogicalOperator,_true> local_38;
  
  local_78 = (pointer)0x0;
  pCStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_c8 = this;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_78,
            (long)(compress_exprs->
                  super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(compress_exprs->
                  super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  this_03 = (compress_exprs->
            super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (compress_exprs->
           super_vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != puVar1) {
    do {
      pCVar7 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
               ::operator->(this_03);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_78,&pCVar7->expression);
      this_03 = this_03 + 1;
    } while (this_03 != puVar1);
  }
  iVar8 = Binder::GenerateTableIndex(local_c8->optimizer->binder);
  this_01 = (LogicalProjection *)operator_new(0x70);
  local_b8._0_8_ = local_78;
  local_b8._8_8_ = pCStack_70;
  local_b8._16_8_ = local_68;
  local_78 = (pointer)0x0;
  pCStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  LogicalProjection::LogicalProjection
            (this_01,iVar8,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)local_b8);
  local_d0._M_head_impl = this_01;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_b8);
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  if (pLVar9->has_estimated_cardinality == true) {
    pLVar10 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_d0);
    pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(child_op);
    LogicalOperator::SetEstimatedCardinality
              (&pLVar10->super_LogicalOperator,pLVar9->estimated_cardinality);
  }
  pLVar10 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
            ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          *)&local_d0);
  LogicalOperator::ResolveOperatorTypes(&pLVar10->super_LogicalOperator);
  pLVar10 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
            ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          *)&local_d0);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              *)&(pLVar10->super_LogicalOperator).children,child_op);
  _Var4._M_head_impl = local_d0._M_head_impl;
  local_d0._M_head_impl = (LogicalProjection *)0x0;
  _Var2._M_head_impl =
       (child_op->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (child_op->
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       &(_Var4._M_head_impl)->super_LogicalOperator;
  if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  (*pLVar9->_vptr_LogicalOperator[2])(local_b8,pLVar9);
  pCVar3 = (child_info->bindings_after).
           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_start;
  (child_info->bindings_after).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
  (child_info->bindings_after).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
  (child_info->bindings_after).
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  if ((pCVar3 != (pointer)0x0) && (operator_delete(pCVar3), (pointer)local_b8._0_8_ != (pointer)0x0)
     ) {
    operator_delete((void *)local_b8._0_8_);
  }
  pLVar9 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(child_op);
  local_c0 = info;
  local_60 = compress_exprs;
  ColumnBindingReplacer::ColumnBindingReplacer((ColumnBindingReplacer *)local_58);
  if ((child_info->bindings_before).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (child_info->bindings_before).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar13 = 0;
    do {
      pvVar11 = vector<duckdb::ColumnBinding,_true>::operator[](&child_info->bindings_before,sVar13)
      ;
      __args_1 = vector<duckdb::ColumnBinding,_true>::operator[](&child_info->bindings_after,sVar13)
      ;
      __args_2 = vector<duckdb::LogicalType,_true>::operator[](&pLVar9->types,sVar13);
      ::std::vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>>::
      emplace_back<duckdb::ColumnBinding_const&,duckdb::ColumnBinding_const&,duckdb::LogicalType_const&>
                ((vector<duckdb::ReplacementBinding,std::allocator<duckdb::ReplacementBinding>> *)
                 &local_50,pvVar11,__args_1,__args_2);
      ::std::
      _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&local_c8->statistics_map->_M_h,pvVar11);
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)(child_info->bindings_before).
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(child_info->bindings_before).
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_38.ptr = (child_op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  this_00 = &local_c8->root;
  optional_ptr<duckdb::LogicalOperator,_true>::CheckValid(this_00);
  ColumnBindingReplacer::VisitOperator((ColumnBindingReplacer *)local_58,this_00->ptr);
  for (__k = local_50.
             super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != local_50.
             super__Vector_base<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    __it = ::std::
           _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_c0,&__k->old_binding);
    if (__it.
        super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
        ._M_cur != (__node_type *)0x0) {
      iVar8 = (__k->old_binding).table_index;
      iVar12 = (__k->old_binding).column_index;
      if ((*(idx_t *)((long)__it.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                            ._M_cur + 0x18) == iVar8) &&
         (*(idx_t *)((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x20) == iVar12)) {
        iVar8 = (__k->new_binding).column_index;
        *(idx_t *)((long)__it.
                         super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                         ._M_cur + 0x18) = (__k->new_binding).table_index;
        *(idx_t *)((long)__it.
                         super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                         ._M_cur + 0x20) = iVar8;
        iVar8 = (__k->old_binding).table_index;
        iVar12 = (__k->old_binding).column_index;
      }
      if ((*(idx_t *)((long)__it.
                            super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                            ._M_cur + 8) == iVar8) &&
         (*(idx_t *)((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x10) == iVar12)) {
        local_b8._0_8_ =
             *(idx_t *)((long)__it.
                              super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                              ._M_cur + 0x18);
        local_b8._8_8_ =
             *(undefined8 *)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                     ._M_cur + 0x20);
        LogicalType::LogicalType
                  ((LogicalType *)(local_b8 + 0x10),
                   (LogicalType *)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                          ._M_cur + 0x28));
        pCVar5 = local_c0;
        local_90 = *(undefined1 *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x40);
        local_88 = *(BaseStatistics **)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                           ._M_cur + 0x48);
        *(undefined8 *)
         ((long)__it.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                ._M_cur + 0x48) = 0;
        ::std::
        _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::erase((_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_c0,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_duckdb::CMBindingInfo>,_true>
                ._M_cur);
        ::std::
        _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<duckdb::ColumnBinding&,duckdb::CMBindingInfo>
                  ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::CMBindingInfo>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)pCVar5,&__k->new_binding,local_b8);
        pBVar6 = local_88;
        if (local_88 != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics(local_88);
          operator_delete(pBVar6);
        }
        local_88 = (BaseStatistics *)0x0;
        LogicalType::~LogicalType((LogicalType *)(local_b8 + 0x10));
      }
    }
  }
  if ((child_info->bindings_after).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (child_info->bindings_after).
      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar13 = 0;
    do {
      pvVar11 = vector<duckdb::ColumnBinding,_true>::operator[](&child_info->bindings_after,sVar13);
      this_02 = vector<duckdb::unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>,_true>
                ::operator[](local_60,sVar13);
      pCVar7 = unique_ptr<duckdb::CompressExpression,_std::default_delete<duckdb::CompressExpression>,_true>
               ::operator->(this_02);
      ::std::
      _Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<duckdb::ColumnBinding_const&,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((_Hashtable<duckdb::ColumnBinding,std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>,std::allocator<std::pair<duckdb::ColumnBinding_const,duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>,std::__detail::_Select1st,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_c8->statistics_map,pvVar11,&pCVar7->stats);
      sVar13 = sVar13 + 1;
    } while (sVar13 < (ulong)((long)(child_info->bindings_after).
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(child_info->bindings_after).
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    .
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_58 = (undefined1  [8])&PTR__ColumnBindingReplacer_0197fe60;
  ::std::vector<duckdb::ReplacementBinding,_std::allocator<duckdb::ReplacementBinding>_>::~vector
            (&local_50);
  if (local_d0._M_head_impl != (LogicalProjection *)0x0) {
    (*((local_d0._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_78);
  return;
}

Assistant:

void CompressedMaterialization::CreateCompressProjection(unique_ptr<LogicalOperator> &child_op,
                                                         vector<unique_ptr<CompressExpression>> compress_exprs,
                                                         CompressedMaterializationInfo &info, CMChildInfo &child_info) {
	// Replace child op with a projection
	vector<unique_ptr<Expression>> projections;
	projections.reserve(compress_exprs.size());
	for (auto &compress_expr : compress_exprs) {
		projections.emplace_back(std::move(compress_expr->expression));
	}
	const auto table_index = optimizer.binder.GenerateTableIndex();
	auto compress_projection = make_uniq<LogicalProjection>(table_index, std::move(projections));
	if (child_op->has_estimated_cardinality) {
		compress_projection->SetEstimatedCardinality(child_op->estimated_cardinality);
	}
	compress_projection->ResolveOperatorTypes();

	compress_projection->children.emplace_back(std::move(child_op));
	child_op = std::move(compress_projection);

	// Get the new bindings and types
	child_info.bindings_after = child_op->GetColumnBindings();
	const auto &new_types = child_op->types;

	// Initialize a ColumnBindingReplacer with the new bindings and types
	ColumnBindingReplacer replacer;
	auto &replacement_bindings = replacer.replacement_bindings;
	for (idx_t col_idx = 0; col_idx < child_info.bindings_before.size(); col_idx++) {
		const auto &old_binding = child_info.bindings_before[col_idx];
		const auto &new_binding = child_info.bindings_after[col_idx];
		const auto &new_type = new_types[col_idx];
		replacement_bindings.emplace_back(old_binding, new_binding, new_type);

		// Remove the old binding from the statistics map
		statistics_map.erase(old_binding);
	}

	// Make sure we stop at the compress operator when replacing bindings
	replacer.stop_operator = child_op.get();

	// Make the plan consistent again
	replacer.VisitOperator(*root);

	// Replace in/out exprs in the binding map too
	auto &binding_map = info.binding_map;
	for (auto &replacement_binding : replacement_bindings) {
		auto it = binding_map.find(replacement_binding.old_binding);
		if (it == binding_map.end()) {
			continue;
		}
		auto &binding_info = it->second;
		if (binding_info.binding == replacement_binding.old_binding) {
			binding_info.binding = replacement_binding.new_binding;
		}

		if (it->first == replacement_binding.old_binding) {
			auto binding_info_local = std::move(binding_info);
			binding_map.erase(it);
			binding_map.emplace(replacement_binding.new_binding, std::move(binding_info_local));
		}
	}

	// Add projection stats to statistics map
	for (idx_t col_idx = 0; col_idx < child_info.bindings_after.size(); col_idx++) {
		const auto &binding = child_info.bindings_after[col_idx];
		auto &stats = compress_exprs[col_idx]->stats;
		statistics_map.emplace(binding, std::move(stats));
	}
}